

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_26::BinaryReader::PrintError(BinaryReader *this,char *format,...)

{
  BinaryReaderDelegate *pBVar1;
  _func_int *p_Var2;
  Offset OVar3;
  long lVar4;
  long *plVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  uint uVar9;
  char *__s;
  undefined8 uStack_1e0;
  char local_1d8 [8];
  char fixed_buf [128];
  undefined8 local_a8;
  va_list args;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  va_list args_copy;
  
  uVar9 = 1;
  if (this->reading_custom_section_ == true) {
    uVar9 = (uint)this->options_->fail_on_custom_section_error;
  }
  local_a8 = 0x3000000010;
  args[0]._0_8_ = &stack0x00000008;
  args[0].overflow_arg_area = fixed_buf + 0x78;
  local_48 = 0x3000000010;
  __s = local_1d8;
  uStack_1e0 = 0x155726;
  args_copy[0]._0_8_ = args[0]._0_8_;
  args_copy[0].overflow_arg_area = args[0].overflow_arg_area;
  iVar6 = vsnprintf(__s,0x80,format,&local_a8);
  sVar8 = (long)iVar6 + 1;
  if (0x80 < sVar8) {
    lVar4 = -((long)iVar6 + 0x10U & 0xfffffffffffffff0);
    __s = local_1d8 + lVar4;
    *(undefined8 *)((long)&uStack_1e0 + lVar4) = 0x155755;
    vsnprintf(__s,sVar8,format,&local_48);
  }
  builtin_strncpy(__s + -8,"mW\x15",4);
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  sVar8 = strlen(__s);
  args[0].reg_save_area._0_4_ = uVar9;
  local_68[0] = local_58;
  __s[-8] = -0x74;
  __s[-7] = 'W';
  __s[-6] = '\x15';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,__s,__s + sVar8);
  pBVar1 = this->delegate_;
  p_Var2 = pBVar1->_vptr_BinaryReaderDelegate[2];
  __s[-8] = -99;
  __s[-7] = 'W';
  __s[-6] = '\x15';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  iVar6 = (*p_Var2)(pBVar1,&args[0].reg_save_area);
  if ((char)iVar6 == '\0') {
    OVar3 = (this->state_).offset;
    pcVar7 = "error";
    if (uVar9 == 0) {
      pcVar7 = "warning";
    }
    __s[-8] = -7;
    __s[-7] = 'W';
    __s[-6] = '\x15';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    fprintf(_stderr,"%07zx: %s: %s\n",OVar3,pcVar7,__s);
  }
  plVar5 = local_68[0];
  if (local_68[0] != local_58) {
    __s[-8] = -0x4a;
    __s[-7] = 'W';
    __s[-6] = '\x15';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    operator_delete(plVar5,local_58[0] + 1);
  }
  return;
}

Assistant:

BinaryReader::PrintError(const char* format,
                                                       ...) {
  ErrorLevel error_level =
      reading_custom_section_ && !options_.fail_on_custom_section_error
          ? ErrorLevel::Warning
          : ErrorLevel::Error;

  WABT_SNPRINTF_ALLOCA(buffer, length, format);
  Error error(error_level, Location(state_.offset), buffer);
  bool handled = delegate_->OnError(error);

  if (!handled) {
    // Not great to just print, but we don't want to eat the error either.
    fprintf(stderr, "%07" PRIzx ": %s: %s\n", state_.offset,
            GetErrorLevelName(error_level), buffer);
  }
}